

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O1

string * __thiscall
lest::
to_string<std::vector<ns::book,std::allocator<ns::book>>,std::vector<ns::book,std::allocator<ns::book>>>
          (string *__return_storage_ptr__,lest *this,
          vector<ns::book,_std::allocator<ns::book>_> *lhs,string *op,
          vector<ns::book,_std::allocator<ns::book>_> *rhs)

{
  ostream *poVar1;
  vector<ns::book,_std::allocator<ns::book>_> *cont;
  vector<ns::book,_std::allocator<ns::book>_> *cont_00;
  ostringstream os;
  ForContainer<std::vector<ns::book>,_std::string> local_1d8;
  ForContainer<std::vector<ns::book>,_std::string> local_1b8;
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  to_string<std::vector<ns::book,std::allocator<ns::book>>>(&local_1b8,this,cont);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_198,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(char *)(lhs->super__Vector_base<ns::book,_std::allocator<ns::book>_>).
                                     _M_impl.super__Vector_impl_data._M_start,
                      (long)(lhs->super__Vector_base<ns::book,_std::allocator<ns::book>_>)._M_impl.
                            super__Vector_impl_data._M_finish);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  to_string<std::vector<ns::book,std::allocator<ns::book>>>(&local_1d8,(lest *)op,cont_00);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

auto to_string( L const & lhs, std::string op, R const & rhs ) -> std::string
{
    std::ostringstream os; os << to_string( lhs ) << " " << op << " " << to_string( rhs ); return os.str();
}